

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ConcreteFactory *this;
  undefined4 extraout_var;
  Product *p;
  Factory *factory;
  char **argv_local;
  int argc_local;
  
  this = (ConcreteFactory *)operator_new(8);
  ConcreteFactory::ConcreteFactory(this);
  iVar1 = (*(this->super_Factory)._vptr_Factory[2])();
  if (this != (ConcreteFactory *)0x0) {
    (*(this->super_Factory)._vptr_Factory[1])();
  }
  if ((long *)CONCAT44(extraout_var,iVar1) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 8))();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Factory* factory = new ConcreteFactory();
	Product* p = factory->createProduct();

	delete factory;
	delete p;

	return 0;
}